

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sprites.c
# Opt level: O1

void dw2_midenhall(dw_rom *rom)

{
  vpatch(rom,0x13b4,0x4f,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,
         0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,
         0,0x50,0,0x51,0,0x52,0,0x53,0,0x54,0,0x55,0,0x56,0,0x57,0,0x50);
  vpatch(rom,0x14b4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14d4,0xf,0x48,0,0x49,0,0x4a,0,0x4b,0,0x4c,0,0x4d,0,0x4e,0,0x4f);
  vpatch(rom,0x14f4,0xd,0x48,0,0xa9,3,0x4a,0,0xab,3,0x4c,0,0xad,3,0x4e);
  vpatch(rom,0x15b4,0x43,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,
         0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,
         0,0x30,0,0x31,0,0x32,0,0x33,0,0x34,0,0x35,0,0x36,0,0x37,0,0xb4);
  vpatch(rom,0x15fe,1,0x35);
  vpatch(rom,0x16b4,0x43,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,
         0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,
         0,0x40,0,0x41,0,0x42,0,0x43,0,0x44,0,0x45,0,0x46,0,0x47,0,0xb8);
  vpatch(rom,0x16fe,1,0x45);
  vpatch(rom,0x1705,3,0,0x39,0);
  vpatch(rom,0x1a8b,3,0x36,0x30,0x11);
  vpatch(rom,0x12300,0x80,3,7,4,4,0xb,0xf,7,3,3,7,7,0x87,0x8f,0x8d,0x85,0x42,0xf0,0xf8,200,8,0xf4,
         0xfc,0xf8,0xfe,0xf0,0xf8,0xf8,0xf8,0xfc,0x2c,0x28,0x10,0x1f,0xf,0x27,0xc0,0xf7,0x6f,0,0xf,
         0x5f,0x4f,0x7f,0xf7,0x87,0x6f,7,0xf,0x3f,0xea,0xf5,0xdb,0xff,0xfe,0x3c,0x80,0xee,0xff,0xea,
         0x2e,0xee,0xf4,0xb8,0x80,3);
  vpatch(rom,0x12400,0x180,1,3,1,0,7,7,7,0x1f,1,3,7,7,0x87,0xc2,0x62,0x20,0xe0,0xf0,0xf8,0x38,0xc0,
         0xf8,0xf0,0xf0,0xe0,0xf0,0xf8,0xf8,0xf8,0x38,0x70,0x70,0x18,0xb,0x16,0xe,0x1f,0x1f,0x1e,0,
         0x1f,0x1f,9,0x19,0x1b,0x17,0xe,0,0x98,0x18,0x30,0,0xf8,0xfc,0,0xf8,0xf8,0xf8,0xf0,0xf0,0xf8
         ,0xfc,0x78,0xf8,1);
  return;
}

Assistant:

static void dw2_midenhall(dw_rom *rom)
{
    vpatch(rom, 0x013b4,   79,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57,  0x00,  0x50,  0x00,  0x51,  0x00,  0x52,  0x00,  0x53,  0x00,  0x54,  0x00,  0x55,  0x00,  0x56,  0x00,  0x57);
    vpatch(rom, 0x014b4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014d4,   15,  0x48,  0x00,  0x49,  0x00,  0x4a,  0x00,  0x4b,  0x00,  0x4c,  0x00,  0x4d,  0x00,  0x4e,  0x00,  0x4f);
    vpatch(rom, 0x014f4,   13,  0x48,  0x00,  0xa9,  0x03,  0x4a,  0x00,  0xab,  0x03,  0x4c,  0x00,  0xad,  0x03,  0x4e);
    vpatch(rom, 0x015b4,   67,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0x30,  0x00,  0x31,  0x00,  0x32,  0x00,  0x33,  0x00,  0x34,  0x00,  0x35,  0x00,  0x36,  0x00,  0x37,  0x00,  0xb4,  0x03,  0x31);
    vpatch(rom, 0x015fe,    1,  0x35);
    vpatch(rom, 0x016b4,   67,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0x40,  0x00,  0x41,  0x00,  0x42,  0x00,  0x43,  0x00,  0x44,  0x00,  0x45,  0x00,  0x46,  0x00,  0x47,  0x00,  0xb8,  0x03,  0x41);
    vpatch(rom, 0x016fe,    1,  0x45);
    vpatch(rom, 0x01705,    3,  0x00,  0x39,  0x00);
    vpatch(rom, 0x01a8b,    3,  0x36,  0x30,  0x11);
    vpatch(rom, 0x12300,  128,  0x03,  0x07,  0x04,  0x04,  0x0b,  0x0f,  0x07,  0x03,  0x03,  0x07,  0x07,  0x87,  0x8f,  0x8d,  0x85,  0x42,  0xf0,  0xf8,  0xc8,  0x08,  0xf4,  0xfc,  0xf8,  0xfe,  0xf0,  0xf8,  0xf8,  0xf8,  0xfc,  0x2c,  0x28,  0x10,  0x1f,  0x0f,  0x27,  0xc0,  0xf7,  0x6f,  0x00,  0x0f,  0x5f,  0x4f,  0x7f,  0xf7,  0x87,  0x6f,  0x07,  0x0f,  0x3f,  0xea,  0xf5,  0xdb,  0xff,  0xfe,  0x3c,  0x80,  0xee,  0xff,  0xea,  0x2e,  0xee,  0xf4,  0xb8,  0x80,  0x03,  0x07,  0x04,  0x04,  0x0b,  0x0f,  0x07,  0x03,  0x13,  0x17,  0x17,  0x17,  0x2f,  0x2d,  0x25,  0x22,  0xf0,  0xf8,  0xc8,  0x08,  0xf4,  0xfc,  0xf8,  0xf3,  0xf0,  0xf8,  0xf8,  0xf8,  0xfc,  0x2c,  0x28,  0x10,  0x1f,  0xef,  0xe7,  0xe0,  0x6f,  0x1f,  0x0f,  0x00,  0x3f,  0xff,  0x9f,  0x97,  0x6f,  0x1f,  0x0f,  0x00,  0x3f,  0xfa,  0xfd,  0xc6,  0xff,  0xff,  0x01,  0x7c,  0xfb,  0xff,  0xfa,  0x3b,  0xfb,  0xfd,  0x78,  0x7c);
    vpatch(rom, 0x12400,  384,  0x01,  0x03,  0x01,  0x00,  0x07,  0x07,  0x07,  0x1f,  0x01,  0x03,  0x07,  0x07,  0x87,  0xc2,  0x62,  0x20,  0xe0,  0xf0,  0xf8,  0x38,  0xc0,  0xf8,  0xf0,  0xf0,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0x38,  0x70,  0x70,  0x18,  0x0b,  0x16,  0x0e,  0x1f,  0x1f,  0x1e,  0x00,  0x1f,  0x1f,  0x09,  0x19,  0x1b,  0x17,  0x0e,  0x00,  0x98,  0x18,  0x30,  0x00,  0xf8,  0xfc,  0x00,  0xf8,  0xf8,  0xf8,  0xf0,  0xf0,  0xf8,  0xfc,  0x78,  0xf8,  0x01,  0x03,  0x01,  0x00,  0x07,  0x07,  0x07,  0x03,  0x11,  0x13,  0x17,  0x17,  0x17,  0x12,  0x12,  0x10,  0xe0,  0xf0,  0xf8,  0x38,  0xc0,  0xf8,  0xf0,  0xf0,  0xe0,  0xf0,  0xf8,  0xf8,  0xf8,  0x38,  0x70,  0x10,  0x06,  0x36,  0x33,  0x3b,  0x17,  0x0f,  0x00,  0x07,  0x17,  0x3f,  0x2e,  0x20,  0x16,  0x0f,  0x03,  0x07,  0xe8,  0xa8,  0x50,  0xb0,  0xf0,  0xf8,  0x70,  0xc0,  0xf8,  0xf8,  0xa0,  0xe0,  0xe0,  0x58,  0xb0,  0xc0,  0x07,  0x0f,  0x1f,  0x1c,  0x03,  0x1f,  0x0f,  0x0f,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1c,  0x0e,  0x0e,  0x80,  0xc0,  0x80,  0x00,  0xe0,  0xe0,  0xe0,  0xc0,  0x80,  0xc0,  0xe0,  0xe0,  0xe1,  0x43,  0x46,  0x0c,  0x19,  0x18,  0x0c,  0x01,  0x1f,  0x3f,  0x18,  0x03,  0x1f,  0x1f,  0x0f,  0x0e,  0x1e,  0x3f,  0x1b,  0x03,  0xe0,  0xc0,  0xc0,  0x80,  0xe0,  0xf0,  0x00,  0xe0,  0xf8,  0xf0,  0x20,  0x40,  0x60,  0xf0,  0xc0,  0xe0,  0x07,  0x0f,  0x1f,  0x1c,  0x03,  0x1f,  0x0f,  0x0f,  0x07,  0x0f,  0x1f,  0x1f,  0x1f,  0x1c,  0x0e,  0x0e,  0x80,  0xc0,  0x80,  0x00,  0xe0,  0xe0,  0xe0,  0xc0,  0x90,  0xd0,  0xf0,  0xf0,  0xf0,  0x50,  0x50,  0x10,  0x1c,  0x1c,  0x0e,  0x00,  0x1f,  0x3f,  0x00,  0x1f,  0x1f,  0x1f,  0x0f,  0x0f,  0x1f,  0x3f,  0x1e,  0x1f,  0xe0,  0x78,  0x38,  0x70,  0xe0,  0xf0,  0xe0,  0x00,  0xf0,  0xf8,  0xc8,  0x90,  0xe0,  0xf0,  0xe0,  0x00,  0x0f,  0x1f,  0x1f,  0x1f,  0x2f,  0x30,  0x1f,  0xcf,  0x0f,  0x1f,  0x1f,  0x1f,  0x3f,  0x3f,  0x1f,  0x0f,  0xc0,  0xe0,  0xe0,  0xe0,  0xd0,  0x30,  0xe0,  0xc0,  0xc8,  0xe8,  0xe8,  0xe8,  0xf4,  0xf4,  0xe4,  0xc4,  0xff,  0xbf,  0x1f,  0x00,  0xff,  0xff,  0xbc,  0x01,  0x78,  0x7f,  0xff,  0xff,  0x3f,  0x7f,  0x3d,  0x01,  0xfe,  0xf1,  0xe7,  0x06,  0xe0,  0xf0,  0x00,  0xf8,  0x7e,  0xff,  0xf9,  0xea,  0xe0,  0xf0,  0xf0,  0xf8,  0x0f,  0x1f,  0x1f,  0x1f,  0x2f,  0x30,  0x1f,  0x7f,  0x0f,  0x1f,  0x1f,  0x1f,  0x3f,  0x3f,  0x1f,  0x0f,  0xc0,  0xe0,  0xe0,  0xe0,  0xd0,  0x30,  0xe0,  0xc0,  0xc0,  0xe0,  0xe1,  0xe1,  0xf1,  0xf1,  0xe1,  0xc2,  0xff,  0xbf,  0x9f,  0x80,  0xff,  0x7f,  0x20,  0x3e,  0x78,  0x7f,  0x7f,  0x7f,  0x1f,  0x3f,  0x1e,  0x3e,  0xf8,  0xf3,  0xe7,  0x07,  0xf6,  0xf8,  0xf0,  0x00,  0x7a,  0xff,  0xf9,  0xe9,  0xf2,  0xf8,  0xf0,  0x00);
}